

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void update_tremor(IT_CHANNEL *channel)

{
  IT_CHANNEL *channel_local;
  
  if (((channel->tremor_time & 0x80) != 0) && (channel->playing != (IT_PLAYING *)0x0)) {
    if (channel->tremor_time == 0x80) {
      channel->tremor_time = (byte)((int)(uint)channel->lastI >> 4) | 0xc0;
    }
    else if (channel->tremor_time == 0xc0) {
      channel->tremor_time = channel->lastI & 0xf | 0x80;
    }
    else {
      channel->tremor_time = channel->tremor_time + 0xff;
    }
  }
  return;
}

Assistant:

static void update_tremor(IT_CHANNEL *channel)
{
	if ((channel->tremor_time & 128) && channel->playing) {
		if (channel->tremor_time == 128)
			channel->tremor_time = (channel->lastI >> 4) | 192;
		else if (channel->tremor_time == 192)
			channel->tremor_time = (channel->lastI & 15) | 128;
		else
			channel->tremor_time--;
	}
}